

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86::forward
          (DeconvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  _func_int **pp_Var8;
  Layer *pLVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint _elempack;
  uint uVar24;
  _func_int *p_Var25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  undefined4 *puVar32;
  _func_int *p_Var33;
  int iVar34;
  int iVar35;
  long lVar36;
  int iVar37;
  int iVar38;
  undefined1 (*pauVar39) [16];
  float *pfVar40;
  size_t sVar41;
  ulong uVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  int iVar46;
  int iVar47;
  undefined1 extraout_var [12];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [12];
  undefined1 auVar58 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  v4sf one;
  float fVar62;
  float fVar63;
  float fVar70;
  float fVar71;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar72;
  undefined1 auVar67 [16];
  float fVar64;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar77 [16];
  void *local_278;
  Mat local_228;
  ulong local_1e0;
  Option opt_p;
  Mat local_170;
  undefined1 local_128 [16];
  void *local_118;
  long local_110;
  Mat m_1;
  Mat m;
  Option opt_g;
  
  iVar31 = bottom_blob->w;
  iVar3 = bottom_blob->h;
  uVar45 = bottom_blob->elemsize;
  iVar35 = bottom_blob->elempack;
  p_Var25 = this->_vptr_DeconvolutionDepthWise_x86[-3];
  if (opt->use_packing_layout == true) {
    uVar43 = (uint)(((&this->field_0xd0)[(long)p_Var25] & 3) == 0) * 3 + 1;
  }
  else {
    uVar43 = 1;
  }
  iVar29 = (*(int *)(&this->field_0xd4 + (long)p_Var25) + -1) *
           *(int *)(&this->field_0xdc + (long)p_Var25);
  iVar46 = *(int *)(&this->field_0xe4 + (long)p_Var25);
  iVar30 = (*(int *)(&this->field_0xd8 + (long)p_Var25) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var25);
  iVar20 = *(int *)(&this->field_0xe8 + (long)p_Var25);
  iVar37 = *(int *)(&this->field_0xfc + (long)p_Var25);
  iVar19 = *(int *)(&this->field_0x100 + (long)p_Var25);
  uVar24 = bottom_blob->c;
  local_228.cstep = 0;
  local_228.data = (void *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize._0_4_ = 0;
  local_228.elemsize._4_4_ = 0;
  local_228.elempack = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  p_Var33 = this->_vptr_DeconvolutionDepthWise_x86[-3];
  p_Var25 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86 + (long)p_Var33);
  lVar28 = 0x10;
  if (((((*(int *)(&this->field_0xec + (long)p_Var33) < 1) && (*(int *)(p_Var25 + 0xf0) < 1)) &&
       (*(int *)(p_Var25 + 0xf4) < 1)) && (*(int *)(p_Var25 + 0xf8) < 1)) &&
     ((*(int *)(p_Var25 + 0x104) < 1 || (*(int *)(p_Var25 + 0x108) < 1)))) {
    if (&local_228 != top_blob) {
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      local_228.data = top_blob->data;
      local_228.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_228.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_228.elemsize._0_4_ = (undefined4)top_blob->elemsize;
      local_228.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
      local_228.elempack = top_blob->elempack;
      local_228.allocator = top_blob->allocator;
      uVar13 = top_blob->dims;
      uVar14 = top_blob->w;
      uVar15 = top_blob->h;
      uVar16 = top_blob->d;
      local_228.c = top_blob->c;
      local_228.cstep = top_blob->cstep;
      p_Var33 = this->_vptr_DeconvolutionDepthWise_x86[-3];
      local_228.dims = uVar13;
      local_228.w = uVar14;
      local_228.h = uVar15;
      local_228.d = uVar16;
    }
    p_Var25 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86 + (long)p_Var33);
    lVar28 = 8;
  }
  iVar37 = iVar37 + (iVar31 + -1) * iVar46 + iVar29 + 1;
  iVar46 = iVar19 + 1 + (iVar3 + -1) * iVar20 + iVar30;
  sVar41 = (uVar45 / (ulong)(long)iVar35) * (ulong)uVar43;
  Mat::create(&local_228,iVar37,iVar46,*(int *)(p_Var25 + 0xd0) / (int)uVar43,sVar41,uVar43,
              *(Allocator **)(&opt->lightmode + lVar28));
  pvVar6 = local_228.data;
  auVar12 = _DAT_004f9020;
  auVar48 = _DAT_004f8ff0;
  auVar58 = _DAT_004f8fe0;
  if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0)) {
    p_Var25 = this->_vptr_DeconvolutionDepthWise_x86[-3];
    iVar19 = iVar35 * uVar24;
    iVar20 = *(int *)(&this->field_0x114 + (long)p_Var25);
    if ((iVar19 == iVar20) && (iVar19 == *(int *)(&this->field_0xd0 + (long)p_Var25))) {
      iVar20 = *(int *)(&this->field_0xd8 + (long)p_Var25) *
               *(int *)(&this->field_0xd4 + (long)p_Var25);
      if (iVar35 == 1) {
        lVar28 = local_228.cstep * CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize)
        ;
        local_278 = (this->weight_data_tm).data;
        iVar35 = bottom_blob->w;
        sVar41 = bottom_blob->elemsize;
        local_110 = bottom_blob->cstep * sVar41;
        if (iVar37 < 1) {
          iVar37 = 0;
        }
        uVar45 = 0;
        local_118 = bottom_blob->data;
        if (iVar46 < 1) {
          iVar46 = 0;
        }
        uVar26 = (ulong)uVar24;
        if ((int)uVar24 < 1) {
          uVar26 = uVar45;
        }
        while (pvVar7 = local_118, uVar45 != uVar26) {
          puVar32 = (undefined4 *)(lVar28 * uVar45 + (long)pvVar6);
          lVar36 = local_110 * uVar45;
          local_1e0 = uVar45;
          for (iVar19 = 0; iVar19 != iVar46; iVar19 = iVar19 + 1) {
            pp_Var8 = this->_vptr_DeconvolutionDepthWise_x86;
            for (iVar47 = 0; iVar47 != iVar37; iVar47 = iVar47 + 1) {
              p_Var25 = pp_Var8[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var25) == 0) {
                auVar57 = ZEXT812(0);
              }
              else {
                auVar57._4_8_ = 0;
                auVar57._0_4_ =
                     *(uint *)(*(long *)(&this->field_0x1b0 + (long)p_Var25) + local_1e0 * 4);
              }
              auVar58._12_4_ = 0;
              auVar58._0_12_ = auVar57;
              iVar38 = 0;
              iVar34 = *(int *)(&this->field_0xd8 + (long)p_Var25);
              if (*(int *)(&this->field_0xd8 + (long)p_Var25) < 1) {
                iVar34 = iVar38;
              }
              for (; fVar59 = auVar58._0_4_, iVar38 != iVar34; iVar38 = iVar38 + 1) {
                iVar21 = *(int *)(&this->field_0xe0 + (long)p_Var25) * iVar38 + (iVar19 - iVar30);
                if (((-1 < iVar21) &&
                    (iVar22 = iVar21 / *(int *)(&this->field_0xe8 + (long)p_Var25),
                    iVar21 % *(int *)(&this->field_0xe8 + (long)p_Var25) == 0)) && (iVar22 < iVar3))
                {
                  uVar43 = *(uint *)(&this->field_0xd4 + (long)p_Var25);
                  uVar45 = 0;
                  if (0 < (int)uVar43) {
                    uVar45 = (ulong)uVar43;
                  }
                  for (uVar27 = 0; uVar45 != uVar27; uVar27 = uVar27 + 1) {
                    iVar21 = *(int *)(&this->field_0xdc + (long)p_Var25) * (int)uVar27 +
                             (iVar47 - iVar29);
                    if (((-1 < iVar21) &&
                        (iVar23 = iVar21 / *(int *)(&this->field_0xe4 + (long)p_Var25),
                        iVar21 % *(int *)(&this->field_0xe4 + (long)p_Var25) == 0)) &&
                       (iVar23 < iVar31)) {
                      auVar58._0_4_ =
                           auVar58._0_4_ +
                           *(float *)((long)local_278 +
                                     uVar27 * 4 + (long)(int)(uVar43 * iVar38) * 4) *
                           *(float *)((long)pvVar7 +
                                     (long)iVar23 * 4 +
                                     (long)iVar22 * (long)iVar35 * sVar41 + lVar36);
                    }
                  }
                }
              }
              auVar48 = auVar58;
              switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var25)) {
              case 1:
                if (fVar59 <= 0.0) {
                  auVar12._12_4_ = 0;
                  auVar12._0_12_ = auVar58._4_12_;
                  auVar48 = auVar12 << 0x20;
                }
                break;
              case 2:
                auVar48 = ZEXT416((uint)((float)(-(uint)(0.0 < fVar59) & 0x3f800000 |
                                                ~-(uint)(0.0 < fVar59) &
                                                **(uint **)(&this->field_0x120 + (long)p_Var25)) *
                                        fVar59));
                break;
              case 3:
                fVar60 = **(float **)(&this->field_0x120 + (long)p_Var25);
                if (fVar59 <= fVar60) {
                  auVar58._0_4_ = fVar60;
                }
                fVar59 = (*(float **)(&this->field_0x120 + (long)p_Var25))[1];
                auVar48 = auVar58;
                if (fVar59 < auVar58._0_4_) {
LAB_003dd3ce:
                  auVar48 = ZEXT416((uint)fVar59);
                }
                break;
              case 4:
                if (88.37626 <= fVar59) {
                  fVar59 = 88.37626;
                }
                fVar59 = expf((float)(-(uint)(fVar59 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar59 < -88.37626) & (uint)-fVar59));
                auVar48 = ZEXT416((uint)(1.0 / (fVar59 + 1.0)));
                break;
              case 5:
                local_128 = auVar58;
                fVar59 = expf(fVar59);
                fVar59 = logf(fVar59 + 1.0);
                fVar59 = tanhf(fVar59);
                auVar48._0_4_ = fVar59 * (float)local_128._0_4_;
                auVar48._4_12_ = extraout_var;
                break;
              case 6:
                fVar60 = **(float **)(&this->field_0x120 + (long)p_Var25);
                fVar61 = (*(float **)(&this->field_0x120 + (long)p_Var25))[1];
                fVar62 = -fVar61 / fVar60;
                auVar48 = ZEXT816(0);
                if ((fVar62 <= fVar59) && (auVar48 = auVar58, fVar59 <= fVar62 + 1.0 / fVar60)) {
                  fVar59 = (fVar60 * fVar59 + fVar61) * fVar59;
                  goto LAB_003dd3ce;
                }
              }
              *puVar32 = auVar48._0_4_;
              puVar32 = puVar32 + 1;
            }
          }
          local_278 = (void *)((long)local_278 + (long)iVar20 * 4);
          uVar45 = local_1e0 + 1;
        }
      }
      else if (iVar35 == 4) {
        uVar45 = 0;
        if (iVar37 < 1) {
          iVar37 = 0;
        }
        if (iVar46 < 1) {
          iVar46 = 0;
        }
        uVar26 = (ulong)uVar24;
        if ((int)uVar24 < 1) {
          uVar26 = uVar45;
        }
        fVar59 = (float)DAT_004f9020;
        fVar60 = DAT_004f9020._4_4_;
        fVar61 = DAT_004f9020._8_4_;
        fVar62 = DAT_004f9020._12_4_;
        for (uVar27 = 0; uVar27 != uVar26; uVar27 = uVar27 + 1) {
          pauVar39 = (undefined1 (*) [16])
                     (local_228.cstep * uVar27 *
                      CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize) +
                     (long)local_228.data);
          iVar35 = bottom_blob->w;
          sVar41 = bottom_blob->cstep;
          sVar5 = bottom_blob->elemsize;
          pvVar6 = bottom_blob->data;
          local_1e0 = uVar27 * 0x10;
          pvVar7 = (this->weight_data_tm).data;
          for (iVar19 = 0; iVar19 != iVar46; iVar19 = iVar19 + 1) {
            pp_Var8 = this->_vptr_DeconvolutionDepthWise_x86;
            local_128._0_4_ = iVar19;
            for (iVar47 = 0; auVar69 = ZEXT816(0), iVar47 != iVar37; iVar47 = iVar47 + 1) {
              p_Var25 = pp_Var8[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var25) == 0) {
                auVar49 = ZEXT816(0);
              }
              else {
                auVar49 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x1b0 + (long)p_Var25) + local_1e0);
              }
              iVar38 = 0;
              iVar34 = *(int *)(&this->field_0xd8 + (long)p_Var25);
              if (*(int *)(&this->field_0xd8 + (long)p_Var25) < 1) {
                iVar34 = iVar38;
              }
              for (; iVar38 != iVar34; iVar38 = iVar38 + 1) {
                iVar21 = *(int *)(&this->field_0xe0 + (long)p_Var25) * iVar38 + (iVar19 - iVar30);
                if (((-1 < iVar21) &&
                    (iVar22 = iVar21 / *(int *)(&this->field_0xe8 + (long)p_Var25),
                    iVar21 % *(int *)(&this->field_0xe8 + (long)p_Var25) == 0)) && (iVar22 < iVar3))
                {
                  uVar43 = *(uint *)(&this->field_0xd4 + (long)p_Var25);
                  uVar44 = 0;
                  if (0 < (int)uVar43) {
                    uVar44 = (ulong)uVar43;
                  }
                  pfVar40 = (float *)((long)pvVar7 +
                                     (long)(int)(uVar43 * iVar38) * 0x10 + (long)(int)uVar45 * 4);
                  for (uVar42 = 0; uVar44 != uVar42; uVar42 = uVar42 + 1) {
                    iVar21 = *(int *)(&this->field_0xdc + (long)p_Var25) * (int)uVar42 +
                             (iVar47 - iVar29);
                    auVar50 = auVar49;
                    if (((-1 < iVar21) &&
                        (iVar23 = iVar21 / *(int *)(&this->field_0xe4 + (long)p_Var25),
                        iVar21 % *(int *)(&this->field_0xe4 + (long)p_Var25) == 0)) &&
                       (iVar23 < iVar31)) {
                      auVar65 = *(undefined1 (*) [16])
                                 ((long)pvVar6 +
                                 (long)(iVar23 << 2) * 4 +
                                 (long)iVar22 * (long)iVar35 * sVar5 + sVar41 * uVar27 * sVar5);
                      auVar50._0_4_ = auVar49._0_4_ + *pfVar40 * auVar65._0_4_;
                      auVar50._4_4_ = auVar49._4_4_ + pfVar40[1] * auVar65._4_4_;
                      auVar50._8_4_ = auVar49._8_4_ + pfVar40[2] * auVar65._8_4_;
                      auVar50._12_4_ = auVar49._12_4_ + pfVar40[3] * auVar65._12_4_;
                    }
                    pfVar40 = pfVar40 + 4;
                    auVar49 = auVar50;
                  }
                }
              }
              fVar53 = auVar49._8_4_;
              fVar64 = auVar49._12_4_;
              auVar65 = auVar49;
              if (5 < *(int *)(&this->field_0x118 + (long)p_Var25) - 1U)
              goto switchD_003dc79d_caseD_1;
              auVar65 = maxps(auVar49,auVar69);
              switch(*(int *)(&this->field_0x118 + (long)p_Var25)) {
              case 2:
                auVar69 = minps(auVar49,auVar69);
                fVar53 = **(float **)(&this->field_0x120 + (long)p_Var25);
                auVar66._0_4_ = auVar65._0_4_ + fVar53 * auVar69._0_4_;
                auVar66._4_4_ = auVar65._4_4_ + fVar53 * auVar69._4_4_;
                auVar66._8_4_ = auVar65._8_4_ + fVar53 * auVar69._8_4_;
                auVar66._12_4_ = auVar65._12_4_ + fVar53 * auVar69._12_4_;
                auVar65 = auVar66;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var25);
                uVar2 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var25))[1];
                auVar56._4_4_ = uVar1;
                auVar56._0_4_ = uVar1;
                auVar56._8_4_ = uVar1;
                auVar56._12_4_ = uVar1;
                auVar67._4_4_ = uVar2;
                auVar67._0_4_ = uVar2;
                auVar67._8_4_ = uVar2;
                auVar67._12_4_ = uVar2;
                auVar69 = maxps(auVar49,auVar56);
                auVar65 = minps(auVar69,auVar67);
                break;
              case 4:
                auVar51._0_8_ = auVar49._0_8_ ^ 0x8000000080000000;
                auVar51._8_4_ = -fVar53;
                auVar51._12_4_ = -fVar64;
                auVar69 = minps(auVar51,auVar58);
                auVar69 = maxps(auVar69,auVar48);
                fVar64 = auVar69._0_4_ * 1.442695 + 0.5;
                fVar74 = auVar69._4_4_ * 1.442695 + 0.5;
                fVar76 = auVar69._8_4_ * 1.442695 + 0.5;
                fVar70 = auVar69._12_4_ * 1.442695 + 0.5;
                fVar53 = (float)(int)fVar64;
                fVar73 = (float)(int)fVar74;
                fVar75 = (float)(int)fVar76;
                fVar63 = (float)(int)fVar70;
                fVar53 = fVar53 - (float)(-(uint)(fVar64 < fVar53) & (uint)fVar59);
                fVar73 = fVar73 - (float)(-(uint)(fVar74 < fVar73) & (uint)fVar60);
                fVar75 = fVar75 - (float)(-(uint)(fVar76 < fVar75) & (uint)fVar61);
                fVar63 = fVar63 - (float)(-(uint)(fVar70 < fVar63) & (uint)fVar62);
                fVar64 = fVar53 * -0.6931472 + auVar69._0_4_;
                fVar74 = fVar73 * -0.6931472 + auVar69._4_4_;
                fVar76 = fVar75 * -0.6931472 + auVar69._8_4_;
                fVar70 = fVar63 * -0.6931472 + auVar69._12_4_;
                auVar52._0_4_ = fVar64 * fVar64;
                auVar52._4_4_ = fVar74 * fVar74;
                auVar52._8_4_ = fVar76 * fVar76;
                auVar52._12_4_ = fVar70 * fVar70;
                fVar71 = (float)((int)fVar53 * 0x800000 + (int)fVar59) *
                         (fVar64 + fVar59 +
                         (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) *
                            fVar64 + 0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) *
                         auVar52._0_4_) + fVar59;
                fVar72 = (float)((int)fVar73 * 0x800000 + (int)fVar60) *
                         (fVar74 + fVar60 +
                         (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) *
                            fVar74 + 0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) *
                         auVar52._4_4_) + fVar60;
                fVar75 = (float)((int)fVar75 * 0x800000 + (int)fVar61) *
                         (fVar76 + fVar61 +
                         (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) *
                            fVar76 + 0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5) *
                         auVar52._8_4_) + fVar61;
                fVar76 = (float)((int)fVar63 * 0x800000 + (int)fVar62) *
                         (fVar70 + fVar62 +
                         (((((fVar70 * 0.00019875691 + 0.0013981999) * fVar70 + 0.008333452) *
                            fVar70 + 0.041665796) * fVar70 + 0.16666666) * fVar70 + 0.5) *
                         auVar52._12_4_) + fVar62;
                auVar49._4_4_ = fVar72;
                auVar49._0_4_ = fVar71;
                auVar49._8_4_ = fVar75;
                auVar49._12_4_ = fVar76;
                auVar69 = rcpps(auVar52,auVar49);
                fVar53 = auVar69._0_4_;
                fVar64 = auVar69._4_4_;
                fVar73 = auVar69._8_4_;
                fVar74 = auVar69._12_4_;
                auVar65._0_4_ = (fVar59 - fVar71 * fVar53) * fVar53 + fVar53;
                auVar65._4_4_ = (fVar60 - fVar72 * fVar64) * fVar64 + fVar64;
                auVar65._8_4_ = (fVar61 - fVar75 * fVar73) * fVar73 + fVar73;
                auVar65._12_4_ = (fVar62 - fVar76 * fVar74) * fVar74 + fVar74;
                break;
              case 5:
                auVar69 = minps(auVar49,auVar58);
                auVar69 = maxps(auVar69,auVar48);
                fVar73 = auVar69._0_4_ * 1.442695 + 0.5;
                fVar74 = auVar69._4_4_ * 1.442695 + 0.5;
                fVar75 = auVar69._8_4_ * 1.442695 + 0.5;
                fVar76 = auVar69._12_4_ * 1.442695 + 0.5;
                fVar63 = (float)(int)fVar73;
                fVar70 = (float)(int)fVar74;
                fVar71 = (float)(int)fVar75;
                fVar72 = (float)(int)fVar76;
                fVar63 = fVar63 - (float)(-(uint)(fVar73 < fVar63) & (uint)fVar59);
                fVar70 = fVar70 - (float)(-(uint)(fVar74 < fVar70) & (uint)fVar60);
                fVar71 = fVar71 - (float)(-(uint)(fVar75 < fVar71) & (uint)fVar61);
                fVar72 = fVar72 - (float)(-(uint)(fVar76 < fVar72) & (uint)fVar62);
                fVar73 = auVar69._0_4_ - fVar63 * 0.6931472;
                fVar74 = auVar69._4_4_ - fVar70 * 0.6931472;
                fVar75 = auVar69._8_4_ - fVar71 * 0.6931472;
                fVar76 = auVar69._12_4_ - fVar72 * 0.6931472;
                auVar77._0_4_ =
                     (float)((int)fVar63 * 0x800000 + (int)fVar59) *
                     (fVar73 + fVar59 +
                     (((((fVar73 * 0.00019875691 + 0.0013981999) * fVar73 + 0.008333452) * fVar73 +
                       0.041665796) * fVar73 + 0.16666666) * fVar73 + 0.5) * fVar73 * fVar73) +
                     fVar59;
                auVar77._4_4_ =
                     (float)((int)fVar70 * 0x800000 + (int)fVar60) *
                     (fVar74 + fVar60 +
                     (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                       0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) * fVar74 * fVar74) +
                     fVar60;
                auVar77._8_4_ =
                     (float)((int)fVar71 * 0x800000 + (int)fVar61) *
                     (fVar75 + fVar61 +
                     (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                       0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) * fVar75 * fVar75) +
                     fVar61;
                auVar77._12_4_ =
                     (float)((int)fVar72 * 0x800000 + (int)fVar62) *
                     (fVar76 + fVar62 +
                     (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
                       0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5) * fVar76 * fVar76) +
                     fVar62;
                auVar69 = maxps(auVar77,_DAT_004f9090);
                fVar73 = (float)(auVar69._0_4_ & 0x807fffff | 0x3f000000);
                fVar75 = (float)(auVar69._4_4_ & 0x807fffff | 0x3f000000);
                fVar63 = (float)(auVar69._8_4_ & 0x807fffff | 0x3f000000);
                fVar71 = (float)(auVar69._12_4_ & 0x807fffff | 0x3f000000);
                fVar74 = fVar73 + -1.0 + (float)(-(uint)(fVar73 < 0.70710677) & (uint)fVar73);
                fVar76 = fVar75 + -1.0 + (float)(-(uint)(fVar75 < 0.70710677) & (uint)fVar75);
                fVar70 = fVar63 + -1.0 + (float)(-(uint)(fVar63 < 0.70710677) & (uint)fVar63);
                fVar72 = fVar71 + -1.0 + (float)(-(uint)(fVar71 < 0.70710677) & (uint)fVar71);
                auVar54._0_8_ =
                     CONCAT44(-(uint)(auVar77._4_4_ <= 0.0),-(uint)(auVar77._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar54._8_4_ = -(uint)(auVar77._8_4_ <= 0.0) & 0x7fffffff;
                auVar54._12_4_ = -(uint)(auVar77._12_4_ <= 0.0) & 0x7fffffff;
                auVar10._4_4_ =
                     ~-(uint)(auVar77._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar75 < 0.70710677) & (uint)fVar60)) *
                             DAT_004f9030._4_4_ + fVar76 +
                            (((((((((fVar76 * 0.070376836 + -0.1151461) * fVar76 + 0.116769984) *
                                   fVar76 + -0.12420141) * fVar76 + 0.14249323) * fVar76 +
                                -0.16668057) * fVar76 + 0.20000714) * fVar76 + -0.24999994) * fVar76
                             + 0.3333333) * fVar76 + -0.5) * fVar76 * fVar76) * -2.0);
                auVar10._0_4_ =
                     ~-(uint)(auVar77._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar73 < 0.70710677) & (uint)fVar59)) *
                             (float)DAT_004f9030 + fVar74 +
                            (((((((((fVar74 * 0.070376836 + -0.1151461) * fVar74 + 0.116769984) *
                                   fVar74 + -0.12420141) * fVar74 + 0.14249323) * fVar74 +
                                -0.16668057) * fVar74 + 0.20000714) * fVar74 + -0.24999994) * fVar74
                             + 0.3333333) * fVar74 + -0.5) * fVar74 * fVar74) * -2.0);
                auVar10._8_4_ =
                     ~-(uint)(auVar77._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar63 < 0.70710677) & (uint)fVar61)) *
                             DAT_004f9030._8_4_ + fVar70 +
                            (((((((((fVar70 * 0.070376836 + -0.1151461) * fVar70 + 0.116769984) *
                                   fVar70 + -0.12420141) * fVar70 + 0.14249323) * fVar70 +
                                -0.16668057) * fVar70 + 0.20000714) * fVar70 + -0.24999994) * fVar70
                             + 0.3333333) * fVar70 + -0.5) * fVar70 * fVar70) * -2.0);
                auVar10._12_4_ =
                     ~-(uint)(auVar77._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar71 < 0.70710677) & (uint)fVar62)) *
                             DAT_004f9030._12_4_ + fVar72 +
                            (((((((((fVar72 * 0.070376836 + -0.1151461) * fVar72 + 0.116769984) *
                                   fVar72 + -0.12420141) * fVar72 + 0.14249323) * fVar72 +
                                -0.16668057) * fVar72 + 0.20000714) * fVar72 + -0.24999994) * fVar72
                             + 0.3333333) * fVar72 + -0.5) * fVar72 * fVar72) * -2.0);
                auVar69 = minps(auVar54 | auVar10,auVar58);
                auVar69 = maxps(auVar69,auVar48);
                fVar73 = auVar69._0_4_ * 1.442695 + 0.5;
                fVar74 = auVar69._4_4_ * 1.442695 + 0.5;
                fVar75 = auVar69._8_4_ * 1.442695 + 0.5;
                fVar76 = auVar69._12_4_ * 1.442695 + 0.5;
                fVar63 = (float)(int)fVar73;
                fVar70 = (float)(int)fVar74;
                fVar71 = (float)(int)fVar75;
                fVar72 = (float)(int)fVar76;
                fVar63 = fVar63 - (float)(-(uint)(fVar73 < fVar63) & (uint)fVar59);
                fVar70 = fVar70 - (float)(-(uint)(fVar74 < fVar70) & (uint)fVar60);
                fVar71 = fVar71 - (float)(-(uint)(fVar75 < fVar71) & (uint)fVar61);
                fVar72 = fVar72 - (float)(-(uint)(fVar76 < fVar72) & (uint)fVar62);
                fVar73 = auVar69._0_4_ - fVar63 * (float)DAT_004f9030;
                fVar74 = auVar69._4_4_ - fVar70 * DAT_004f9030._4_4_;
                fVar75 = auVar69._8_4_ - fVar71 * DAT_004f9030._8_4_;
                fVar76 = auVar69._12_4_ - fVar72 * DAT_004f9030._12_4_;
                auVar55._0_4_ =
                     fVar73 + fVar59 +
                     (((((fVar73 * 0.00019875691 + 0.0013981999) * fVar73 + 0.008333452) * fVar73 +
                       0.041665796) * fVar73 + 0.16666666) * fVar73 + 0.5) * fVar73 * fVar73;
                auVar55._4_4_ =
                     fVar74 + fVar60 +
                     (((((fVar74 * 0.00019875691 + 0.0013981999) * fVar74 + 0.008333452) * fVar74 +
                       0.041665796) * fVar74 + 0.16666666) * fVar74 + 0.5) * fVar74 * fVar74;
                auVar55._8_4_ =
                     fVar75 + fVar61 +
                     (((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) * fVar75 +
                       0.041665796) * fVar75 + 0.16666666) * fVar75 + 0.5) * fVar75 * fVar75;
                auVar55._12_4_ =
                     fVar76 + fVar62 +
                     (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
                       0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5) * fVar76 * fVar76;
                fVar63 = (float)((int)fVar63 * 0x800000 + (int)fVar59) * auVar55._0_4_ + fVar59;
                fVar70 = (float)((int)fVar70 * 0x800000 + (int)fVar60) * auVar55._4_4_ + fVar60;
                fVar71 = (float)((int)fVar71 * 0x800000 + (int)fVar61) * auVar55._8_4_ + fVar61;
                fVar72 = (float)((int)fVar72 * 0x800000 + (int)fVar62) * auVar55._12_4_ + fVar62;
                auVar11._4_4_ = fVar70;
                auVar11._0_4_ = fVar63;
                auVar11._8_4_ = fVar71;
                auVar11._12_4_ = fVar72;
                auVar69 = rcpps(auVar55,auVar11);
                fVar73 = auVar69._0_4_;
                fVar74 = auVar69._4_4_;
                fVar75 = auVar69._8_4_;
                fVar76 = auVar69._12_4_;
                auVar69._0_4_ = fVar73 + fVar73 + -1.0 + (2.0 - fVar63 * (fVar73 + fVar73)) * fVar73
                ;
                auVar69._4_4_ = fVar74 + fVar74 + -1.0 + (2.0 - fVar70 * (fVar74 + fVar74)) * fVar74
                ;
                auVar69._8_4_ = fVar75 + fVar75 + -1.0 + (2.0 - fVar71 * (fVar75 + fVar75)) * fVar75
                ;
                auVar69._12_4_ =
                     fVar76 + fVar76 + -1.0 + (2.0 - fVar72 * (fVar76 + fVar76)) * fVar76;
                goto LAB_003dcb03;
              case 6:
                fVar73 = **(float **)(&this->field_0x120 + (long)p_Var25);
                fVar74 = (*(float **)(&this->field_0x120 + (long)p_Var25))[1];
                auVar68._0_4_ = fVar73 * auVar49._0_4_ + fVar74;
                auVar68._4_4_ = fVar73 * auVar49._4_4_ + fVar74;
                auVar68._8_4_ = fVar73 * fVar53 + fVar74;
                auVar68._12_4_ = fVar73 * fVar64 + fVar74;
                auVar69 = maxps(auVar68,auVar69);
                auVar69 = minps(auVar69,auVar12);
LAB_003dcb03:
                auVar65._0_4_ = auVar69._0_4_ * auVar49._0_4_;
                auVar65._4_4_ = auVar69._4_4_ * auVar49._4_4_;
                auVar65._8_4_ = auVar69._8_4_ * fVar53;
                auVar65._12_4_ = auVar69._12_4_ * fVar64;
              }
switchD_003dc79d_caseD_1:
              *pauVar39 = auVar65;
              pauVar39 = pauVar39 + 1;
            }
          }
          uVar45 = (ulong)(uint)((int)uVar45 + iVar20 * 4);
        }
      }
    }
    else {
      iVar31 = (int)((long)iVar19 / (long)iVar20);
      uVar45 = (long)*(int *)(&this->field_0xd0 + (long)p_Var25) / (long)iVar20;
      if (opt->use_packing_layout == true) {
        _elempack = (uint)((uVar45 & 3) == 0) * 3 + 1;
        uVar24 = (uint)(((long)iVar19 / (long)iVar20 & 3U) == 0) * 3 + 1;
      }
      else {
        _elempack = 1;
        uVar24 = _elempack;
      }
      local_170.data = bottom_blob->data;
      local_170.refcount = bottom_blob->refcount;
      local_170.elemsize = bottom_blob->elemsize;
      local_170.elempack = bottom_blob->elempack;
      local_170.allocator = bottom_blob->allocator;
      local_170.dims = bottom_blob->dims;
      local_170.w = bottom_blob->w;
      local_170.h = bottom_blob->h;
      local_170.d = bottom_blob->d;
      local_170.c = bottom_blob->c;
      local_170.cstep = bottom_blob->cstep;
      if (local_170.refcount != (int *)0x0) {
        LOCK();
        *local_170.refcount = *local_170.refcount + 1;
        UNLOCK();
      }
      if ((int)uVar24 < iVar35) {
        opt_p.lightmode = opt->lightmode;
        opt_p._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_p.num_threads = opt->num_threads;
        opt_p.workspace_allocator = opt->workspace_allocator;
        opt_p.openmp_blocktime = opt->openmp_blocktime;
        opt_p.use_winograd_convolution = opt->use_winograd_convolution;
        opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_p.use_int8_inference = opt->use_int8_inference;
        opt_p.use_vulkan_compute = opt->use_vulkan_compute;
        opt_p.use_bf16_storage = opt->use_bf16_storage;
        opt_p.use_fp16_packed = opt->use_fp16_packed;
        opt_p.use_fp16_storage = opt->use_fp16_storage;
        opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_p.use_int8_packed = opt->use_int8_packed;
        opt_p.use_int8_storage = opt->use_int8_storage;
        opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_p.use_packing_layout = opt->use_packing_layout;
        opt_p.use_shader_pack8 = opt->use_shader_pack8;
        opt_p.use_subgroup_basic = opt->use_subgroup_basic;
        opt_p.use_subgroup_vote = opt->use_subgroup_vote;
        opt_p.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_p.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_p.use_image_storage = opt->use_image_storage;
        opt_p.use_tensor_storage = opt->use_tensor_storage;
        opt_p.use_reserved_0 = opt->use_reserved_0;
        opt_p.flush_denormals = opt->flush_denormals;
        opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_p.use_shader_local_memory = opt->use_shader_local_memory;
        opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_p.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_p.use_reserved_7 = opt->use_reserved_7;
        opt_p.use_reserved_8 = opt->use_reserved_8;
        opt_p.use_reserved_9 = opt->use_reserved_9;
        opt_p.use_reserved_10 = opt->use_reserved_10;
        opt_p.use_reserved_11 = opt->use_reserved_11;
        opt_p.blob_allocator = opt->workspace_allocator;
        convert_packing(bottom_blob,&local_170,uVar24,&opt_p);
      }
      sVar5 = local_228.cstep;
      opt_p.blob_allocator =
           (Allocator *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
      opt_p._0_8_ = local_228.data;
      opt_p.workspace_allocator =
           (Allocator *)CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
      opt_p.openmp_blocktime = local_228.elempack;
      opt_p._32_8_ = local_228.allocator;
      opt_p._44_4_ = local_228.w;
      opt_p._40_4_ = local_228.dims;
      opt_p._52_4_ = local_228.d;
      opt_p.flush_denormals = local_228.h;
      opt_p.use_winograd43_convolution = (bool)(undefined1)local_228.c;
      opt_p.use_winograd63_convolution = (bool)local_228.c._1_1_;
      opt_p.use_a53_a55_optimized_kernel = (bool)local_228.c._2_1_;
      opt_p.use_reserved_7 = (bool)local_228.c._3_1_;
      if (opt_p.blob_allocator != (Allocator *)0x0) {
        LOCK();
        *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
             *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
        UNLOCK();
      }
      if ((_elempack < uVar43) &&
         ((Mat::create((Mat *)&opt_p,iVar37,iVar46,
                       *(int *)(&this->field_0xd0 + (long)this->_vptr_DeconvolutionDepthWise_x86[-3]
                               ) / (int)_elempack,(ulong)_elempack * (sVar41 / uVar43),_elempack,
                       opt->workspace_allocator), opt_p._0_8_ == 0 ||
          ((long)(int)opt_p._56_4_ * sVar5 == 0)))) {
        iVar31 = -100;
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
            if (opt_p._32_8_ == 0) {
              free((void *)opt_p._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
            }
          }
        }
        if (local_170.refcount != (int *)0x0) {
          LOCK();
          *local_170.refcount = *local_170.refcount + -1;
          UNLOCK();
          if (*local_170.refcount == 0) {
            if (local_170.allocator == (Allocator *)0x0) {
              free(local_170.data);
            }
            else {
              (*(local_170.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_003dd55e;
      }
      iVar3 = (int)uVar45;
      iVar46 = 0;
      iVar35 = 0;
      for (lVar28 = 0; uVar18 = opt_p._48_8_, uVar17 = opt_p._40_8_,
          lVar28 < *(int *)(&this->field_0x114 + (long)this->_vptr_DeconvolutionDepthWise_x86[-3]);
          lVar28 = lVar28 + 1) {
        m.c = iVar31 / (int)uVar24;
        m.data = (void *)((long)(iVar46 / (int)uVar24) * local_170.cstep * local_170.elemsize +
                         (long)local_170.data);
        m.refcount = (int *)0x0;
        m.elemsize = local_170.elemsize;
        m.elempack = local_170.elempack;
        m.allocator = local_170.allocator;
        m.w = local_170.w;
        m.h = local_170.h;
        m.d = local_170.d;
        m.cstep = ((long)local_170.d * local_170.elemsize * (long)local_170.h * (long)local_170.w +
                   0xf & 0xfffffffffffffff0) / local_170.elemsize;
        m.dims = local_170.dims;
        m_1.c = iVar3 / (int)_elempack;
        m_1.data = (void *)((long)(iVar35 / (int)_elempack) * sVar5 *
                            (long)opt_p.workspace_allocator + opt_p._0_8_);
        m_1.refcount = (int *)0x0;
        m_1.elemsize = (size_t)opt_p.workspace_allocator;
        m_1.elempack = opt_p.openmp_blocktime;
        m_1.allocator = (Allocator *)opt_p._32_8_;
        m_1.w._0_1_ = opt_p.use_subgroup_shuffle;
        m_1.w._1_1_ = opt_p.use_image_storage;
        m_1.w._2_1_ = opt_p.use_tensor_storage;
        m_1.w._3_1_ = opt_p.use_reserved_0;
        m_1.h = opt_p.flush_denormals;
        m_1.d._0_1_ = opt_p.use_local_pool_allocator;
        m_1.d._1_1_ = opt_p.use_shader_local_memory;
        m_1.d._2_1_ = opt_p.use_cooperative_matrix;
        m_1.d._3_1_ = opt_p.use_winograd23_convolution;
        m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                     (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU &
                    0xfffffffffffffff0) / (ulong)opt_p.workspace_allocator;
        opt_p._40_4_ = SUB84(uVar17,0);
        m_1.dims._0_1_ = opt_p.use_shader_pack8;
        m_1.dims._1_1_ = opt_p.use_subgroup_basic;
        m_1.dims._2_1_ = opt_p.use_subgroup_vote;
        m_1.dims._3_1_ = opt_p.use_subgroup_ballot;
        pLVar9 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar28];
        opt_g.lightmode = opt->lightmode;
        opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g.num_threads = opt->num_threads;
        opt_g.workspace_allocator = opt->workspace_allocator;
        opt_g.openmp_blocktime = opt->openmp_blocktime;
        opt_g.use_winograd_convolution = opt->use_winograd_convolution;
        opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_g.use_int8_inference = opt->use_int8_inference;
        opt_g.use_vulkan_compute = opt->use_vulkan_compute;
        opt_g.use_bf16_storage = opt->use_bf16_storage;
        opt_g.use_fp16_packed = opt->use_fp16_packed;
        opt_g.use_fp16_storage = opt->use_fp16_storage;
        opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_g.use_int8_packed = opt->use_int8_packed;
        opt_g.use_int8_storage = opt->use_int8_storage;
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g.use_shader_pack8 = opt->use_shader_pack8;
        opt_g.use_subgroup_basic = opt->use_subgroup_basic;
        opt_g.use_subgroup_vote = opt->use_subgroup_vote;
        opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_g.use_image_storage = opt->use_image_storage;
        opt_g.use_tensor_storage = opt->use_tensor_storage;
        opt_g.use_reserved_0 = opt->use_reserved_0;
        opt_g.flush_denormals = opt->flush_denormals;
        opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_g.use_shader_local_memory = opt->use_shader_local_memory;
        opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_g.use_reserved_7 = opt->use_reserved_7;
        opt_g.use_reserved_8 = opt->use_reserved_8;
        opt_g.use_reserved_9 = opt->use_reserved_9;
        opt_g.use_reserved_10 = opt->use_reserved_10;
        opt_g.use_reserved_11 = opt->use_reserved_11;
        opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
        opt_p._40_8_ = uVar17;
        opt_p._48_8_ = uVar18;
        (*pLVar9->_vptr_Layer[7])(pLVar9,&m,&m_1,&opt_g);
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (m.refcount != (int *)0x0) {
          LOCK();
          *m.refcount = *m.refcount + -1;
          UNLOCK();
          if (*m.refcount == 0) {
            if (m.allocator == (Allocator *)0x0) {
              free(m.data);
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar35 = iVar35 + iVar3;
        iVar46 = iVar46 + iVar31;
      }
      if (_elempack < uVar43) {
        convert_packing((Mat *)&opt_p,&local_228,uVar43,opt);
      }
      else {
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
          UNLOCK();
        }
        piVar4 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_228.allocator == (Allocator *)0x0) {
              free(local_228.data);
            }
            else {
              (*(local_228.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        uVar17 = opt_p._56_8_;
        local_228.data = (void *)opt_p._0_8_;
        local_228.refcount._0_4_ = SUB84(opt_p.blob_allocator,0);
        local_228.refcount._4_4_ = (undefined4)((ulong)opt_p.blob_allocator >> 0x20);
        local_228.elemsize._0_4_ = SUB84(opt_p.workspace_allocator,0);
        local_228.elemsize._4_4_ = (undefined4)((ulong)opt_p.workspace_allocator >> 0x20);
        local_228.elempack = opt_p.openmp_blocktime;
        local_228.allocator = (Allocator *)opt_p._32_8_;
        local_228.dims = opt_p._40_4_;
        local_228.w = opt_p._44_4_;
        local_228.h = opt_p.flush_denormals;
        local_228.d = opt_p._52_4_;
        local_228.c._0_1_ = opt_p.use_winograd43_convolution;
        local_228.c._1_1_ = opt_p.use_winograd63_convolution;
        local_228.c._2_1_ = opt_p.use_a53_a55_optimized_kernel;
        local_228.c._3_1_ = opt_p.use_reserved_7;
        local_228.cstep = sVar5;
        opt_p._56_8_ = uVar17;
      }
      if (opt_p.blob_allocator != (Allocator *)0x0) {
        LOCK();
        *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
             *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
        UNLOCK();
        if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
          if (opt_p._32_8_ == 0) {
            free((void *)opt_p._0_8_);
          }
          else {
            (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
          }
        }
      }
      if (local_170.refcount != (int *)0x0) {
        LOCK();
        *local_170.refcount = *local_170.refcount + -1;
        UNLOCK();
        if (*local_170.refcount == 0) {
          if (local_170.allocator == (Allocator *)0x0) {
            free(local_170.data);
          }
          else {
            (*(local_170.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    DeconvolutionDepthWise::cut_padding
              ((DeconvolutionDepthWise *)
               ((long)&this->_vptr_DeconvolutionDepthWise_x86 +
               (long)this->_vptr_DeconvolutionDepthWise_x86[-3]),&local_228,top_blob,opt);
    if ((top_blob->data != (void *)0x0) && (iVar31 = 0, (long)top_blob->c * top_blob->cstep != 0))
    goto LAB_003dd55e;
  }
  iVar31 = -100;
LAB_003dd55e:
  piVar4 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        free(local_228.data);
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar31;
}

Assistant:

int DeconvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}